

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O1

CharReader * __thiscall Json::CharReaderBuilder::newCharReader(CharReaderBuilder *this)

{
  bool bVar1;
  bool bVar2;
  UInt UVar3;
  Value *pVVar4;
  CharReader *pCVar5;
  Value *this_00;
  OurFeatures features;
  OurFeatures local_38;
  
  this_00 = &this->settings_;
  pVVar4 = Value::operator[](this_00,"collectComments");
  bVar1 = Value::asBool(pVVar4);
  local_38.allowComments_ = false;
  local_38.allowTrailingCommas_ = false;
  local_38.strictRoot_ = false;
  local_38.allowDroppedNullPlaceholders_ = false;
  local_38.allowNumericKeys_ = false;
  local_38.allowSingleQuotes_ = false;
  local_38.failIfExtra_ = false;
  local_38.rejectDupKeys_ = false;
  local_38.allowSpecialFloats_ = false;
  local_38.skipBom_ = false;
  local_38._10_6_ = 0;
  local_38.stackLimit_ = 0;
  pVVar4 = Value::operator[](this_00,"allowComments");
  bVar2 = Value::asBool(pVVar4);
  local_38.allowComments_ = bVar2;
  pVVar4 = Value::operator[](this_00,"allowTrailingCommas");
  bVar2 = Value::asBool(pVVar4);
  local_38.allowTrailingCommas_ = bVar2;
  pVVar4 = Value::operator[](this_00,"strictRoot");
  bVar2 = Value::asBool(pVVar4);
  local_38.strictRoot_ = bVar2;
  pVVar4 = Value::operator[](this_00,"allowDroppedNullPlaceholders");
  bVar2 = Value::asBool(pVVar4);
  local_38.allowDroppedNullPlaceholders_ = bVar2;
  pVVar4 = Value::operator[](this_00,"allowNumericKeys");
  bVar2 = Value::asBool(pVVar4);
  local_38.allowNumericKeys_ = bVar2;
  pVVar4 = Value::operator[](this_00,"allowSingleQuotes");
  bVar2 = Value::asBool(pVVar4);
  local_38.allowSingleQuotes_ = bVar2;
  pVVar4 = Value::operator[](this_00,"stackLimit");
  UVar3 = Value::asUInt(pVVar4);
  local_38.stackLimit_ = (size_t)UVar3;
  pVVar4 = Value::operator[](this_00,"failIfExtra");
  bVar2 = Value::asBool(pVVar4);
  local_38.failIfExtra_ = bVar2;
  pVVar4 = Value::operator[](this_00,"rejectDupKeys");
  bVar2 = Value::asBool(pVVar4);
  local_38.rejectDupKeys_ = bVar2;
  pVVar4 = Value::operator[](this_00,"allowSpecialFloats");
  bVar2 = Value::asBool(pVVar4);
  local_38.allowSpecialFloats_ = bVar2;
  pVVar4 = Value::operator[](this_00,"skipBom");
  bVar2 = Value::asBool(pVVar4);
  local_38.skipBom_ = bVar2;
  pCVar5 = (CharReader *)operator_new(0x140);
  pCVar5->_vptr_CharReader = (_func_int **)&PTR__OurCharReader_00b5a920;
  *(bool *)&pCVar5[1]._vptr_CharReader = bVar1;
  OurReader::OurReader((OurReader *)(pCVar5 + 2),&local_38);
  return pCVar5;
}

Assistant:

CharReader* CharReaderBuilder::newCharReader() const {
  bool collectComments = settings_["collectComments"].asBool();
  OurFeatures features = OurFeatures::all();
  features.allowComments_ = settings_["allowComments"].asBool();
  features.allowTrailingCommas_ = settings_["allowTrailingCommas"].asBool();
  features.strictRoot_ = settings_["strictRoot"].asBool();
  features.allowDroppedNullPlaceholders_ =
      settings_["allowDroppedNullPlaceholders"].asBool();
  features.allowNumericKeys_ = settings_["allowNumericKeys"].asBool();
  features.allowSingleQuotes_ = settings_["allowSingleQuotes"].asBool();

  // Stack limit is always a size_t, so we get this as an unsigned int
  // regardless of it we have 64-bit integer support enabled.
  features.stackLimit_ = static_cast<size_t>(settings_["stackLimit"].asUInt());
  features.failIfExtra_ = settings_["failIfExtra"].asBool();
  features.rejectDupKeys_ = settings_["rejectDupKeys"].asBool();
  features.allowSpecialFloats_ = settings_["allowSpecialFloats"].asBool();
  features.skipBom_ = settings_["skipBom"].asBool();
  return new OurCharReader(collectComments, features);
}